

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O1

QString * __thiscall
QTranslatorPrivate::do_translate
          (QString *__return_storage_ptr__,QTranslatorPrivate *this,char *context,char *sourceText,
          char *comment,int n)

{
  ushort uVar1;
  uint uVar2;
  uchar *puVar3;
  Data *pDVar4;
  qsizetype alloc;
  pointer puVar5;
  QTranslator *pQVar6;
  undefined1 uVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t __n;
  byte bVar13;
  uint *puVar14;
  uint *puVar15;
  ushort uVar16;
  uint *puVar17;
  unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *translator;
  pointer puVar18;
  byte *pbVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  char cVar27;
  uint uVar28;
  ushort *puVar29;
  uint *puVar30;
  bool bVar31;
  bool bVar32;
  byte *local_a8;
  int local_8c;
  uint *local_78;
  ulong local_70;
  int local_5c;
  int local_48;
  int local_40;
  int local_38;
  
  if (context == (char *)0x0) {
    context = "";
  }
  if (sourceText == (char *)0x0) {
    sourceText = "";
  }
  if (comment == (char *)0x0) {
    comment = "";
  }
  uVar2 = this->offsetLength;
  local_a8 = (byte *)comment;
  if (uVar2 != 0) {
    if (this->contextLength != 0) {
      puVar29 = (ushort *)this->contextArray;
      uVar16 = *puVar29 << 8 | *puVar29 >> 8;
      bVar13 = *context;
      if (bVar13 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        pbVar19 = (byte *)context;
        do {
          pbVar19 = pbVar19 + 1;
          uVar21 = (uint)bVar13 + uVar8 * 0x10;
          uVar8 = uVar21 & 0xf0000000;
          uVar8 = ~uVar8 & (uVar8 >> 0x18 ^ uVar21);
          bVar13 = *pbVar19;
        } while (bVar13 != 0);
      }
      uVar1 = puVar29[(ulong)(uVar8 + (uVar8 == 0)) % (ulong)uVar16 + 1];
      if (uVar1 == 0) goto LAB_002d192c;
      puVar29 = puVar29 + (ulong)((uint)(ushort)(uVar1 << 8 | uVar1 >> 8) + (uint)uVar16) + 1;
      sVar10 = strlen(context);
      do {
        bVar13 = (byte)*puVar29;
        puVar29 = (ushort *)((long)puVar29 + 1);
        if (bVar13 == 0) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          iVar9 = 1;
LAB_002d11e4:
          bVar32 = false;
        }
        else {
          sVar11 = (size_t)(bVar13 - 1);
          if (*(byte *)((long)puVar29 + sVar11) != 0) {
            sVar11 = (size_t)(uint)bVar13;
          }
          if (((int)sVar11 == (int)sVar10) && (iVar9 = bcmp(puVar29,context,sVar11), iVar9 == 0)) {
            iVar9 = 3;
            goto LAB_002d11e4;
          }
          puVar29 = (ushort *)((long)puVar29 + (ulong)(uint)bVar13);
          iVar9 = 0;
          bVar32 = true;
        }
      } while (iVar9 == 0);
      if ((iVar9 != 3) && (!bVar32)) {
        return __return_storage_ptr__;
      }
    }
    if (7 < uVar2) {
      local_8c = 0;
      if ((-1 < n) && (uVar8 = this->numerusRulesLength, uVar8 != 0)) {
        puVar3 = this->numerusRulesArray;
        uVar20 = 0;
        iVar9 = 0;
        do {
          bVar13 = 0;
          do {
            bVar23 = bVar13;
            bVar24 = 1;
            do {
              iVar22 = (int)uVar20;
              bVar13 = puVar3[uVar20];
              uVar21 = (uint)n % 10;
              if (((((bVar13 & 0x10) == 0) && (uVar21 = (uint)n % 100, (bVar13 & 0x20) == 0)) &&
                  (uVar21 = n, 999 < n)) && (uVar20 = (ulong)(uint)n, (bVar13 & 0x40) != 0)) {
                do {
                  uVar28 = (uint)uVar20;
                  uVar21 = (uint)(uVar20 / 1000);
                  uVar20 = uVar20 / 1000;
                } while (999999 < uVar28);
              }
              uVar26 = bVar13 & 7;
              uVar28 = iVar22 + 2;
              if (uVar26 - 1 < 4) {
                uVar25 = (uint)puVar3[iVar22 + 1];
                switch(uVar26) {
                case 1:
                  bVar32 = uVar21 == puVar3[iVar22 + 1];
                  break;
                case 2:
                  bVar32 = (int)uVar21 < (int)uVar25;
                  break;
                case 3:
                  bVar32 = (int)uVar21 <= (int)uVar25;
                  break;
                case 4:
                  bVar32 = (int)uVar21 <= (int)(uint)puVar3[uVar28] && (int)uVar25 <= (int)uVar21;
                  uVar28 = iVar22 + 3;
                }
              }
              else {
                bVar32 = true;
              }
              if (uVar28 == uVar8) {
                bVar31 = false;
              }
              else {
                bVar31 = puVar3[uVar28] == 0xfd;
                uVar28 = bVar31 + uVar28;
              }
              uVar20 = (ulong)uVar28;
              bVar24 = bVar24 & ((byte)((bVar13 & 8) >> 3) ^ bVar32);
            } while (bVar31);
            if (uVar28 == uVar8) {
              bVar32 = false;
            }
            else {
              bVar32 = puVar3[uVar20] == 0xfe;
              uVar20 = (ulong)(bVar32 + uVar28);
            }
            bVar13 = bVar23 | bVar24;
          } while (bVar32);
          if (bVar23 == 0 && bVar24 == 0) {
            iVar9 = iVar9 + 1;
            if ((uint)uVar20 == uVar8) {
              bVar32 = false;
              local_8c = iVar9;
            }
            else {
              uVar20 = (ulong)((uint)uVar20 + 1);
              bVar32 = true;
            }
          }
          else {
            bVar32 = false;
            local_8c = iVar9;
          }
        } while (bVar32);
      }
      do {
        bVar13 = *sourceText;
        uVar8 = 0;
        if (bVar13 != 0) {
          uVar8 = 0;
          pbVar19 = (byte *)sourceText;
          do {
            pbVar19 = pbVar19 + 1;
            uVar8 = (uint)bVar13 + uVar8 * 0x10;
            uVar21 = uVar8 & 0xf0000000;
            uVar8 = ~uVar21 & (uVar21 >> 0x18 ^ uVar8);
            bVar13 = *pbVar19;
          } while (bVar13 != 0);
        }
        bVar13 = *comment;
        pbVar19 = (byte *)comment;
        while (bVar13 != 0) {
          pbVar19 = pbVar19 + 1;
          uVar8 = (uint)bVar13 + uVar8 * 0x10;
          uVar21 = uVar8 & 0xf0000000;
          uVar8 = ~uVar21 & (uVar21 >> 0x18 ^ uVar8);
          bVar13 = *pbVar19;
        }
        uVar8 = uVar8 + (uVar8 == 0);
        puVar30 = (uint *)this->offsetArray;
        puVar17 = (uint *)((long)puVar30 + ((ulong)(uVar2 & 0xfffffff8) - 8));
        puVar14 = puVar30;
        do {
          puVar15 = puVar14;
          if (puVar17 < puVar14) break;
          uVar20 = (long)puVar17 - (long)puVar14 >> 1 & 0xfffffffffffffff8;
          puVar15 = (uint *)((long)puVar14 + uVar20);
          uVar21 = *(uint *)((long)puVar14 + uVar20);
          uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                   uVar21 << 0x18;
          if (uVar21 >= uVar8 && uVar21 != uVar8) {
            puVar17 = (uint *)((long)puVar14 + (uVar20 - 8));
          }
          if (uVar21 < uVar8) {
            puVar14 = (uint *)((long)puVar14 + uVar20) + 2;
          }
        } while (uVar21 != uVar8);
        if (puVar17 < puVar15) {
LAB_002d186e:
          cVar27 = (*comment == 0U) * '\x05';
          if (*comment != 0U) {
            comment = "";
          }
        }
        else {
          do {
            puVar14 = puVar15;
            if (puVar14 == puVar30) break;
            puVar15 = puVar14 + -2;
          } while (*puVar14 == puVar14[-2]);
          do {
            if (this->offsetArray + this->offsetLength <= puVar14) goto LAB_002d186e;
            uVar21 = *puVar14;
            if ((uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18
                ) == uVar8) {
              uVar21 = puVar14[1];
              puVar14 = puVar14 + 2;
              (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              puVar3 = this->messageArray;
              puVar30 = (uint *)(puVar3 + (uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 |
                                           (uVar21 & 0xff00) << 8 | uVar21 << 0x18));
              uVar21 = this->messageLength;
              sVar10 = strlen(sourceText);
              sVar11 = strlen(context);
              sVar12 = strlen(comment);
              local_70 = 0;
              local_78 = (uint *)0x0;
              local_5c = local_8c;
              do {
                if (puVar30 < puVar3 + uVar21) {
                  uVar7 = (undefined1)*puVar30;
                  puVar30 = (uint *)((long)puVar30 + 1);
                }
                else {
                  uVar7 = 0;
                }
                iVar9 = 5;
                switch(uVar7) {
                case 1:
                  break;
                default:
                  (__return_storage_ptr__->d).d = (Data *)0x0;
                  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                  (__return_storage_ptr__->d).size = 0;
                  iVar9 = 1;
                  break;
                case 3:
                  uVar28 = *puVar30;
                  uVar26 = uVar28 >> 0x18;
                  uVar28 = uVar26 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8 |
                           uVar28 << 0x18;
                  if ((uVar26 & 1) == 0) {
                    bVar32 = local_5c == 0;
                    local_5c = local_5c + -1;
                    if (bVar32) {
                      local_70 = (ulong)uVar28;
                      local_78 = puVar30 + 1;
                    }
                    puVar30 = (uint *)((long)puVar30 + (long)(int)uVar28 + 4);
                    iVar9 = 4;
                  }
                  else {
                    (__return_storage_ptr__->d).d = (Data *)0x0;
                    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                    (__return_storage_ptr__->d).size = 0;
                    iVar9 = 1;
                  }
                  if ((uVar26 & 1) == 0) goto LAB_002d174a;
                  break;
                case 5:
                  puVar30 = puVar30 + 1;
                  goto LAB_002d174a;
                case 6:
                  uVar28 = *puVar30;
                  uVar26 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8 |
                           uVar28 << 0x18;
                  if (uVar28 == 0) {
                    uVar20 = 0;
                  }
                  else {
                    uVar20 = (ulong)(uVar26 - 1);
                    if (*(char *)((long)puVar30 + uVar20 + 4) != '\0') {
                      uVar20 = (ulong)uVar26;
                    }
                  }
                  local_38 = (int)sVar10;
                  pbVar19 = (byte *)sourceText;
                  if ((int)uVar20 != local_38) goto LAB_002d1725;
LAB_002d170f:
                  iVar9 = bcmp(puVar30 + 1,pbVar19,uVar20);
                  bVar32 = iVar9 == 0;
                  goto LAB_002d1727;
                case 7:
                  uVar28 = *puVar30;
                  uVar26 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8 |
                           uVar28 << 0x18;
                  if (uVar28 == 0) {
                    uVar20 = 0;
                  }
                  else {
                    uVar20 = (ulong)(uVar26 - 1);
                    if (*(char *)((long)puVar30 + uVar20 + 4) != '\0') {
                      uVar20 = (ulong)uVar26;
                    }
                  }
                  local_40 = (int)sVar11;
                  pbVar19 = (byte *)context;
                  if ((int)uVar20 == local_40) goto LAB_002d170f;
LAB_002d1725:
                  bVar32 = false;
LAB_002d1727:
                  puVar30 = puVar30 + 1;
                  if (bVar32) {
                    puVar30 = (uint *)((long)puVar30 + (ulong)uVar26);
                  }
                  else {
                    (__return_storage_ptr__->d).d = (Data *)0x0;
                    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                    (__return_storage_ptr__->d).size = 0;
                  }
                  iVar9 = 1;
                  if (bVar32) {
LAB_002d174a:
                    iVar9 = 0;
                  }
                  break;
                case 8:
                  uVar28 = *puVar30;
                  uVar26 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8 |
                           uVar28 << 0x18;
                  puVar17 = puVar30 + 1;
                  if ((char)puVar30[1] == '\0') {
LAB_002d178c:
                    puVar17 = (uint *)((long)puVar17 + (ulong)uVar26);
                    bVar32 = true;
                  }
                  else {
                    if (uVar28 == 0) {
                      __n = 0;
                    }
                    else {
                      __n = (size_t)(uVar26 - 1);
                      if (*(char *)((long)puVar17 + __n) != '\0') {
                        __n = (size_t)uVar26;
                      }
                    }
                    local_48 = (int)sVar12;
                    if (((int)__n == local_48) && (iVar9 = bcmp(puVar17,comment,__n), iVar9 == 0))
                    goto LAB_002d178c;
                    (__return_storage_ptr__->d).d = (Data *)0x0;
                    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                    (__return_storage_ptr__->d).size = 0;
                    bVar32 = false;
                  }
                  iVar9 = 1;
                  puVar30 = puVar17;
                  if (bVar32) goto LAB_002d174a;
                }
              } while (iVar9 == 0);
              if (iVar9 == 5) {
                if (local_78 == (uint *)0x0) {
                  (__return_storage_ptr__->d).d = (Data *)0x0;
                  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                  (__return_storage_ptr__->d).size = 0;
                }
                else {
                  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  QString::QString(__return_storage_ptr__,local_70 >> 1,Uninitialized);
                  pDVar4 = (__return_storage_ptr__->d).d;
                  alloc = (__return_storage_ptr__->d).size;
                  if ((pDVar4 == (Data *)0x0) ||
                     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                    QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
                  }
                  qbswap<2>(local_78,alloc,(__return_storage_ptr__->d).ptr);
                }
              }
              bVar32 = (__return_storage_ptr__->d).ptr == (char16_t *)0x0;
              cVar27 = !bVar32;
              if ((bVar32) && (pDVar4 = (__return_storage_ptr__->d).d, pDVar4 != (Data *)0x0)) {
                LOCK();
                (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
                }
              }
            }
            else {
              puVar14 = puVar14 + 1;
              cVar27 = '\f';
            }
          } while (cVar27 == '\0');
          if (cVar27 == '\f') goto LAB_002d186e;
        }
      } while (cVar27 == '\0');
      local_a8 = (byte *)comment;
      if (cVar27 != '\x05') {
        return __return_storage_ptr__;
      }
    }
  }
  puVar5 = (this->subTranslators).
           super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar18 = (this->subTranslators).
                 super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar5; puVar18 = puVar18 + 1
      ) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
    pQVar6 = (puVar18->_M_t).super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>.
             _M_t.super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
             super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl;
    (**(code **)((long)(pQVar6->super_QObject)._vptr_QObject + 0x60))
              (__return_storage_ptr__,pQVar6,context,sourceText,local_a8,(ulong)(uint)n);
    if ((__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
      return __return_storage_ptr__;
    }
    pDVar4 = (__return_storage_ptr__->d).d;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_002d192c:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QString QTranslatorPrivate::do_translate(const char *context, const char *sourceText,
                                         const char *comment, int n) const
{
    if (context == nullptr)
        context = "";
    if (sourceText == nullptr)
        sourceText = "";
    if (comment == nullptr)
        comment = "";

    uint numerus = 0;
    size_t numItems = 0;

    if (!offsetLength)
        goto searchDependencies;

    /*
        Check if the context belongs to this QTranslator. If many
        translators are installed, this step is necessary.
    */
    if (contextLength) {
        quint16 hTableSize = read16(contextArray);
        uint g = elfHash(context) % hTableSize;
        const uchar *c = contextArray + 2 + (g << 1);
        quint16 off = read16(c);
        c += 2;
        if (off == 0)
            return QString();
        c = contextArray + (2 + (hTableSize << 1) + (off << 1));

        const uint contextLen = uint(strlen(context));
        for (;;) {
            quint8 len = read8(c++);
            if (len == 0)
                return QString();
            if (match(c, len, context, contextLen))
                break;
            c += len;
        }
    }

    numItems = offsetLength / (2 * sizeof(quint32));
    if (!numItems)
        goto searchDependencies;

    if (n >= 0)
        numerus = numerusHelper(n, numerusRulesArray, numerusRulesLength);

    for (;;) {
        quint32 h = 0;
        elfHash_continue(sourceText, h);
        elfHash_continue(comment, h);
        elfHash_finish(h);

        const uchar *start = offsetArray;
        const uchar *end = start + ((numItems - 1) << 3);
        while (start <= end) {
            const uchar *middle = start + (((end - start) >> 4) << 3);
            uint hash = read32(middle);
            if (h == hash) {
                start = middle;
                break;
            } else if (hash < h) {
                start = middle + 8;
            } else {
                end = middle - 8;
            }
        }

        if (start <= end) {
            // go back on equal key
            while (start != offsetArray && read32(start) == read32(start - 8))
                start -= 8;

            while (start < offsetArray + offsetLength) {
                quint32 rh = read32(start);
                start += 4;
                if (rh != h)
                    break;
                quint32 ro = read32(start);
                start += 4;
                QString tn = getMessage(messageArray + ro, messageArray + messageLength, context,
                                        sourceText, comment, numerus);
                if (!tn.isNull())
                    return tn;
            }
        }
        if (!comment[0])
            break;
        comment = "";
    }

searchDependencies:
    for (const auto &translator : subTranslators) {
        QString tn = translator->translate(context, sourceText, comment, n);
        if (!tn.isNull())
            return tn;
    }
    return QString();
}